

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::getInputs
          (ShaderAtomicXorCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  deUint32 dVar2;
  deBool dVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Random rnd;
  deRandom local_40;
  
  dVar2 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar2);
  lVar4 = 0;
  uVar8 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar7 = uVar8;
    uVar1 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar4 + 1];
    uVar8 = uVar1 * uVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  if (0 < (int)((long)numValues / (long)(int)uVar8)) {
    uVar5 = 0;
    iVar6 = stride;
    do {
      dVar2 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)inputs + (long)(int)(uVar8 * (int)uVar5 * stride)) = dVar2;
      lVar4 = (ulong)uVar8 - 1;
      iVar9 = iVar6;
      if (1 < (int)uVar8) {
        do {
          dVar3 = deRandom_getBool(&local_40);
          *(uint *)((long)inputs + (long)iVar9) = -(uint)(dVar3 == 1);
          iVar9 = iVar9 + stride;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      uVar5 = uVar5 + 1;
      iVar6 = iVar6 + uVar7 * stride * uVar1;
    } while (uVar5 != ((long)numValues / (long)(int)uVar8 & 0xffffffffU));
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			// First uses random bit-pattern.
			*(deUint32*)((deUint8*)inputs + stride*(groupOffset)) = rnd.getUint32();

			// Rest have either all or no bits set.
			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = rnd.getBool() ? ~0u : 0u;
		}
	}